

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# endpoint.hpp
# Opt level: O2

int __thiscall
websocketpp::transport::asio::endpoint<websocketpp::config::asio::transport_config>::listen
          (endpoint<websocketpp::config::asio::transport_config> *this,int __fd,int __n)

{
  uint uVar1;
  error_category *peVar2;
  error_category *peVar3;
  socklen_t in_ECX;
  undefined4 in_register_0000000c;
  undefined4 in_register_00000014;
  error_code *peVar4;
  undefined4 in_register_00000034;
  error_code *ec;
  error_code eVar5;
  error_code bec;
  boolean<1,_2> local_44;
  __shared_ptr<asio::basic_socket_acceptor<asio::ip::tcp>,_(__gnu_cxx::_Lock_policy)2> local_40;
  
  peVar4 = (error_code *)CONCAT44(in_register_00000014,__n);
  if (this->m_state != READY) {
    log::basic<websocketpp::concurrency::basic,_websocketpp::log::elevel>::write
              ((this->m_elog).
               super___shared_ptr<websocketpp::log::basic<websocketpp::concurrency::basic,_websocketpp::log::elevel>,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr,2,"asio::listen called from the wrong state",
               CONCAT44(in_register_0000000c,in_ECX));
    peVar3 = websocketpp::error::get_category();
    peVar4->_M_value = 9;
    peVar4->_M_cat = peVar3;
    goto LAB_001ae3c1;
  }
  log::basic<websocketpp::concurrency::basic,_websocketpp::log::alevel>::write
            ((this->m_alog).
             super___shared_ptr<websocketpp::log::basic<websocketpp::concurrency::basic,_websocketpp::log::alevel>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr,0x400,"asio::listen",CONCAT44(in_register_0000000c,in_ECX));
  bec._M_value = 0;
  peVar2 = (error_category *)std::_V2::system_category();
  local_44.value_ = (uint)(*(short *)CONCAT44(in_register_00000034,__fd) != 2) * 8 + 2;
  bec._M_cat = peVar2;
  ::asio::basic_socket_acceptor<asio::ip::tcp>::open
            ((this->m_acceptor).
             super___shared_ptr<asio::basic_socket_acceptor<asio::ip::tcp>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr,(char *)&local_44,(int)&bec);
  ec = &bec;
  if (bec._M_value == 0) {
    local_44.value_ = (int)this->m_reuse_addr;
    ::asio::basic_socket_acceptor<asio::ip::tcp>::
    set_option<asio::detail::socket_option::boolean<1,2>>
              ((this->m_acceptor).
               super___shared_ptr<asio::basic_socket_acceptor<asio::ip::tcp>,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr,&local_44,&bec);
    ec = &bec;
    if (bec._M_value == 0) {
      if ((this->m_tcp_pre_bind_handler).super__Function_base._M_manager != (_Manager_type)0x0) {
        std::__shared_ptr<asio::basic_socket_acceptor<asio::ip::tcp>,_(__gnu_cxx::_Lock_policy)2>::
        __shared_ptr(&local_40,
                     &(this->m_acceptor).
                      super___shared_ptr<asio::basic_socket_acceptor<asio::ip::tcp>,_(__gnu_cxx::_Lock_policy)2>
                    );
        eVar5 = std::
                function<std::error_code_(std::shared_ptr<asio::basic_socket_acceptor<asio::ip::tcp>_>)>
                ::operator()(&this->m_tcp_pre_bind_handler,
                             (shared_ptr<asio::basic_socket_acceptor<asio::ip::tcp>_> *)&local_40);
        peVar4->_M_value = eVar5._M_value;
        peVar4->_M_cat = eVar5._M_cat;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
        ec = peVar4;
        if (peVar4->_M_value != 0) goto LAB_001ae38f;
      }
      ::asio::basic_socket_acceptor<asio::ip::tcp>::bind
                ((this->m_acceptor).
                 super___shared_ptr<asio::basic_socket_acceptor<asio::ip::tcp>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr,__fd,(sockaddr *)&bec,in_ECX);
      ec = &bec;
      if (bec._M_value == 0) {
        uVar1 = ::asio::basic_socket_acceptor<asio::ip::tcp>::listen
                          ((this->m_acceptor).
                           super___shared_ptr<asio::basic_socket_acceptor<asio::ip::tcp>,_(__gnu_cxx::_Lock_policy)2>
                           ._M_ptr,this->m_listen_backlog,(int)&bec);
        peVar3 = (error_category *)(ulong)uVar1;
        ec = &bec;
        if (bec._M_value == 0) {
          this->m_state = LISTENING;
          peVar4->_M_value = 0;
          peVar4->_M_cat = peVar2;
          goto LAB_001ae3c1;
        }
      }
    }
  }
LAB_001ae38f:
  eVar5 = clean_up_listen_after_error<std::error_code>(this,ec);
  peVar3 = eVar5._0_8_;
  peVar4->_M_value = eVar5._M_value;
  peVar4->_M_cat = eVar5._M_cat;
LAB_001ae3c1:
  return (int)peVar3;
}

Assistant:

void listen(lib::asio::ip::tcp::endpoint const & ep, lib::error_code & ec)
    {
        if (m_state != READY) {
            m_elog->write(log::elevel::library,
                "asio::listen called from the wrong state");
            using websocketpp::error::make_error_code;
            ec = make_error_code(websocketpp::error::invalid_state);
            return;
        }

        m_alog->write(log::alevel::devel,"asio::listen");

        lib::asio::error_code bec;

        m_acceptor->open(ep.protocol(),bec);
        if (bec) {ec = clean_up_listen_after_error(bec);return;}
        
        m_acceptor->set_option(lib::asio::socket_base::reuse_address(m_reuse_addr),bec);
        if (bec) {ec = clean_up_listen_after_error(bec);return;}
        
        // if a TCP pre-bind handler is present, run it
        if (m_tcp_pre_bind_handler) {
            ec = m_tcp_pre_bind_handler(m_acceptor);
            if (ec) {
                ec = clean_up_listen_after_error(ec);
                return;
            }
        }
        
        m_acceptor->bind(ep,bec);
        if (bec) {ec = clean_up_listen_after_error(bec);return;}
        
        m_acceptor->listen(m_listen_backlog,bec);
        if (bec) {ec = clean_up_listen_after_error(bec);return;}
        
        // Success
        m_state = LISTENING;
        ec = lib::error_code();
    }